

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubgraphNode.h
# Opt level: O2

void __thiscall
dg::SubgraphNode<dg::pta::PSNode>::_removeThisFromSuccessorsPredecessors
          (SubgraphNode<dg::pta::PSNode> *this,PSNode *succ)

{
  pointer ppPVar1;
  pointer ppPVar2;
  pointer ppPVar3;
  PSNode *p;
  PSNode *local_50;
  _Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> local_48;
  
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::reserve
            ((vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *)&local_48,
             (long)(succ->super_SubgraphNode<dg::pta::PSNode>)._predecessors.
                   super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl
                   .super__Vector_impl_data._M_finish -
             (long)(succ->super_SubgraphNode<dg::pta::PSNode>)._predecessors.
                   super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl
                   .super__Vector_impl_data._M_start >> 3);
  ppPVar1 = (succ->super_SubgraphNode<dg::pta::PSNode>)._predecessors.
            super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppPVar3 = (succ->super_SubgraphNode<dg::pta::PSNode>)._predecessors.
                 super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppPVar3 != ppPVar1; ppPVar3 = ppPVar3 + 1) {
    local_50 = *ppPVar3;
    if (local_50 == (PSNode *)0x0 || &local_50->super_SubgraphNode<dg::pta::PSNode> != this) {
      std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::push_back
                ((vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *)&local_48,
                 &local_50);
    }
  }
  ppPVar3 = (succ->super_SubgraphNode<dg::pta::PSNode>)._predecessors.
            super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  (succ->super_SubgraphNode<dg::pta::PSNode>)._predecessors.
  super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_48._M_impl.super__Vector_impl_data._M_end_of_storage;
  ppPVar1 = (succ->super_SubgraphNode<dg::pta::PSNode>)._predecessors.
            super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppPVar2 = (succ->super_SubgraphNode<dg::pta::PSNode>)._predecessors.
            super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  (succ->super_SubgraphNode<dg::pta::PSNode>)._predecessors.
  super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = local_48._M_impl.super__Vector_impl_data._M_start;
  (succ->super_SubgraphNode<dg::pta::PSNode>)._predecessors.
  super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = local_48._M_impl.super__Vector_impl_data._M_finish;
  local_48._M_impl.super__Vector_impl_data._M_start = ppPVar1;
  local_48._M_impl.super__Vector_impl_data._M_finish = ppPVar2;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = ppPVar3;
  std::_Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::~_Vector_base(&local_48)
  ;
  return;
}

Assistant:

void _removeThisFromSuccessorsPredecessors(NodeT *succ) {
        std::vector<NodeT *> tmp;
        tmp.reserve(succ->predecessorsNum());
        for (NodeT *p : succ->_predecessors) {
            if (p != this)
                tmp.push_back(p);
        }

        succ->_predecessors.swap(tmp);
    }